

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *data;
  long lVar1;
  char cVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  size_t sVar8;
  char *pcVar9;
  byte *__s;
  __int32_t **pp_Var10;
  char *pcVar11;
  byte bVar12;
  long lVar13;
  byte bVar14;
  _Bool load;
  uchar uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  char command_line [200];
  em8051 _emu;
  char *local_1190;
  undefined2 local_1188;
  undefined1 local_1186;
  em8051 local_10b8;
  
  if (argc < 2) {
    __assert_fail("argc > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x106,"int main(int, char **)");
  }
  __stream = fopen(argv[1],"rb");
  sVar8 = fread(flash,1,0x20000,__stream);
  if (sVar8 != 0x20000) {
    __assert_fail("ret == sizeof(flash)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x109,"int main(int, char **)");
  }
  fclose(__stream);
  memset(&local_10b8,0,0x1088);
  local_10b8.mCodeMem = (uchar *)malloc(0x10000);
  local_10b8.mCodeMemSize = 0x10000;
  local_10b8.mExtData = (uchar *)malloc(0x10000);
  local_10b8.mExtDataSize = 0x10000;
  local_10b8.mLowerData = (uchar *)malloc(0x100);
  local_10b8.mUpperData = local_10b8.mLowerData + 0x80;
  local_10b8.mSFR = (uchar *)malloc(0x80);
  local_10b8.except = emu_exception;
  local_10b8.sfrread = emu_sfrread;
  local_10b8.sfrwrite = sfrwrite;
  local_10b8.xread = xread;
  local_10b8.xwrite = xwrite;
  reset(&local_10b8,1);
  memcpy(local_10b8.mCodeMem,flash + ((local_10b8.mSFR[0x10] & 1) << 0x10),0x10000);
  if (argc != 2) {
    uVar16 = 2;
    do {
      add_command(argv[uVar16]);
      uVar16 = uVar16 + 1;
    } while ((uint)argc != uVar16);
  }
  signal(2,sigint_handler);
  local_1190 = strdup("");
  do {
    if ((requested_pause == true) && (command_count == 0)) {
      printf("> ");
      fgets((char *)&local_1188,200,_stdin);
      pcVar9 = strchr((char *)&local_1188,10);
      if (pcVar9 == (char *)&local_1188) {
        strcpy((char *)&local_1188,local_1190);
      }
      else {
        *pcVar9 = '\0';
        free(local_1190);
        local_1190 = strdup((char *)&local_1188);
      }
      add_command((char *)&local_1188);
    }
    if (command_count != 0) {
      do {
        pcVar9 = *commands;
        bVar18 = false;
        printf("Command \'%s\'\n",pcVar9);
        pcVar9 = strtok(pcVar9," ");
        if (pcVar9 == (char *)0x0) goto LAB_001030ee;
        iVar4 = strcmp(pcVar9,"help");
        if (iVar4 == 0) {
          puts("The help command is not supported yet.");
LAB_001030eb:
          bVar18 = false;
        }
        else {
          iVar4 = strcmp(pcVar9,"pause");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"p"), iVar4 == 0)) {
            requested_pause = true;
            goto LAB_001030eb;
          }
          iVar4 = strcmp(pcVar9,"continue");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"c"), iVar4 == 0)) {
            steps = 0xffffffff;
            bVar18 = true;
          }
          else {
            iVar4 = strcmp(pcVar9,"step");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"s"), iVar4 == 0)) {
              pcVar9 = strtok((char *)0x0," ");
              if (pcVar9 == (char *)0x0) {
                steps = 1;
              }
              else {
                steps = parse_dec(pcVar9);
              }
              bVar18 = steps != 0;
            }
            else {
              iVar4 = strcmp(pcVar9,"quit");
              if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"q"), iVar4 == 0)) {
                exit(0);
              }
              iVar4 = strcmp(pcVar9,"save");
              if (iVar4 == 0) {
                pcVar9 = strtok((char *)0x0," ");
                printf("Saving to \'%s\'\n",pcVar9);
                load = false;
              }
              else {
                iVar4 = strcmp(pcVar9,"load");
                if (iVar4 != 0) {
                  iVar4 = strcmp(pcVar9,"trace");
                  if (iVar4 == 0) {
                    trace = 1;
                    goto LAB_001030eb;
                  }
                  iVar4 = strcmp(pcVar9,"scsi");
                  if (iVar4 == 0) {
                    bVar18 = false;
                    pcVar9 = strtok((char *)0x0," ");
                    if (*pcVar9 != '\0') {
                      lVar13 = (long)scsi_count;
                      iVar4 = scsi_count + 1;
                      lVar17 = 0;
                      do {
                        local_1188 = *(undefined2 *)(pcVar9 + lVar17 * 2);
                        local_1186 = 0;
                        uVar5 = parse_hex((char *)&local_1188);
                        scsi_buffer[lVar13 + lVar17] = (uint8_t)uVar5;
                        scsi_count = iVar4 + (int)lVar17;
                        bVar18 = false;
                        lVar1 = lVar17 * 2;
                        lVar17 = lVar17 + 1;
                      } while (pcVar9[lVar1 + 2] != '\0');
                    }
                  }
                  else {
                    iVar4 = strcmp(pcVar9,"set");
                    bVar18 = false;
                    if (iVar4 == 0) {
                      __s = (byte *)strtok((char *)0x0," ");
                      while (bVar18 = false, __s != (byte *)0x0) {
                        pcVar9 = strchr((char *)__s,0x3d);
                        *pcVar9 = '\0';
                        bVar14 = *__s;
                        if (bVar14 != 0) {
                          pp_Var10 = __ctype_tolower_loc();
                          pbVar3 = __s;
                          do {
                            *pbVar3 = *(byte *)(*pp_Var10 + (char)bVar14);
                            bVar14 = pbVar3[1];
                            pbVar3 = pbVar3 + 1;
                          } while (bVar14 != 0);
                        }
                        data = pcVar9 + 1;
                        printf("Setting \'%s\' to \'%s\'\n",__s,data);
                        iVar4 = strcmp((char *)__s,"pc");
                        if (iVar4 == 0) {
                          uVar5 = parse_hex(data);
                          printf("PC=%04X\n",(ulong)uVar5);
                          local_10b8.mPC = uVar5;
                        }
                        else {
                          bVar14 = *__s;
                          if (bVar14 < 0x72) {
                            if (bVar14 == 0x65) {
                              uVar5 = parse_hex((char *)(__s + 1));
                              if (*data != '\0') {
                                uVar16 = (ulong)(int)uVar5;
                                pcVar9 = pcVar9 + 3;
                                do {
                                  local_1188 = *(undefined2 *)(pcVar9 + -2);
                                  local_1186 = 0;
                                  uVar5 = parse_hex((char *)&local_1188);
                                  printf("EXTMEM_%04X=%02X\n",uVar16 & 0xffffffff,(ulong)uVar5);
                                  local_10b8.mExtData[uVar16] = (uchar)uVar5;
                                  uVar16 = uVar16 + 1;
                                  cVar2 = *pcVar9;
                                  pcVar9 = pcVar9 + 2;
                                } while (cVar2 != '\0');
                              }
                            }
                            else {
                              if (bVar14 == 0x69) goto LAB_00103391;
LAB_0010344a:
                              printf("Unknown register \'%s\'\n",__s);
                            }
                          }
                          else if (bVar14 == 0x73) {
LAB_00103391:
                            pcVar11 = strchr((char *)(__s + 1),0x2e);
                            if (pcVar11 != (char *)0x0) {
                              *pcVar11 = '\0';
                            }
                            uVar5 = parse_hex((char *)(__s + 1));
                            if (0xff < (int)uVar5) {
                              __assert_fail("index < 0x100",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                            ,0xe4,"_Bool handle_command(struct em8051 *, char *)");
                            }
                            uVar16 = (ulong)uVar5;
                            if (pcVar11 == (char *)0x0) {
                              if (*data != '\0') {
                                uVar16 = (ulong)(int)uVar5;
                                pcVar9 = pcVar9 + 3;
                                do {
                                  local_1188 = *(undefined2 *)(pcVar9 + -2);
                                  local_1186 = 0;
                                  uVar5 = parse_hex((char *)&local_1188);
                                  uVar15 = (uchar)uVar5;
                                  if (*__s == 0x73) {
                                    printf("SFR_%02X=%02X\n",uVar16 & 0xffffffff,(ulong)uVar5);
                                    if ((long)uVar16 < 0x80) {
                                      __assert_fail("index >= 0x80",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0xf7,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                    }
                                    local_10b8.mSFR[uVar16 - 0x80] = uVar15;
                                    sfrwrite(&local_10b8,(int)uVar16);
                                  }
                                  else {
                                    if (*__s != 0x69) {
                                      __assert_fail("false",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                  ,0xfb,
                                                  "_Bool handle_command(struct em8051 *, char *)");
                                    }
                                    printf("INTMEM_%02X=%02X\n",uVar16 & 0xffffffff,(ulong)uVar5);
                                    if ((long)uVar16 < 0x80) {
                                      local_10b8.mLowerData[uVar16] = uVar15;
                                    }
                                    else {
                                      local_10b8.mUpperData[uVar16 - 0x80] = uVar15;
                                    }
                                  }
                                  uVar16 = uVar16 + 1;
                                  cVar2 = *pcVar9;
                                  pcVar9 = pcVar9 + 2;
                                } while (cVar2 != '\0');
                              }
                            }
                            else {
                              *pcVar11 = '\0';
                              uVar6 = parse_dec(pcVar11 + 1);
                              uVar7 = parse_hex(data);
                              if (*__s == 0x73) {
                                printf("SFR_%02X.%d=%02X\n",uVar16,(ulong)uVar6,(ulong)(uVar7 != 0))
                                ;
                                if ((int)uVar5 < 0x80) {
                                  __assert_fail("index >= 0x80",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                ,0x119,
                                                "_Bool handle_command(struct em8051 *, char *)");
                                }
                                bVar12 = (byte)(1 << ((byte)uVar6 & 0x1f));
                                bVar14 = ~bVar12 & local_10b8.mSFR[uVar16 - 0x80];
                                if (uVar7 != 0) {
                                  bVar14 = local_10b8.mSFR[uVar16 - 0x80] | bVar12;
                                }
                                local_10b8.mSFR[uVar16 - 0x80] = bVar14;
                                sfrwrite(&local_10b8,uVar5);
                              }
                              else {
                                if (*__s != 0x69) {
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/commands.c"
                                                ,0x121,
                                                "_Bool handle_command(struct em8051 *, char *)");
                                }
                                printf("INTMEM_%02X.%d=%02X\n",uVar16,(ulong)uVar6,
                                       (ulong)(uVar7 != 0));
                                bVar14 = (byte)(1 << ((byte)uVar6 & 0x1f));
                                if ((int)uVar5 < 0x80) {
                                  if (uVar7 == 0) {
                                    bVar14 = local_10b8.mLowerData[(int)uVar5] & ~bVar14;
                                  }
                                  else {
                                    bVar14 = local_10b8.mLowerData[(int)uVar5] | bVar14;
                                  }
                                  local_10b8.mLowerData[(int)uVar5] = bVar14;
                                }
                                else {
                                  if (uVar7 == 0) {
                                    bVar14 = local_10b8.mUpperData[uVar16 - 0x80] & ~bVar14;
                                  }
                                  else {
                                    bVar14 = local_10b8.mUpperData[uVar16 - 0x80] | bVar14;
                                  }
                                  local_10b8.mUpperData[uVar16 - 0x80] = bVar14;
                                }
                              }
                            }
                          }
                          else {
                            if (bVar14 != 0x72) goto LAB_0010344a;
                            pcVar11 = strchr((char *)(__s + 1),0x40);
                            if (pcVar11 == (char *)0x0) {
                              uVar5 = local_10b8.mSFR[0x50] >> 3 & 3;
                            }
                            else {
                              *pcVar11 = '\0';
                              uVar5 = parse_dec(pcVar11 + 1);
                            }
                            uVar6 = parse_dec((char *)(__s + 1));
                            if (*data != '\0') {
                              lVar17 = (long)(int)(uVar5 * 8) + (long)(int)uVar6;
                              pcVar9 = pcVar9 + 3;
                              do {
                                local_1188 = *(undefined2 *)(pcVar9 + -2);
                                local_1186 = 0;
                                uVar7 = parse_hex((char *)&local_1188);
                                printf("R%d@%d=%02X\n",(ulong)uVar6,(ulong)uVar5,(ulong)uVar7);
                                local_10b8.mLowerData[lVar17] = (uchar)uVar7;
                                lVar17 = lVar17 + 1;
                                uVar6 = uVar6 + 1;
                                cVar2 = *pcVar9;
                                pcVar9 = pcVar9 + 2;
                              } while (cVar2 != '\0');
                            }
                          }
                        }
                        __s = (byte *)strtok((char *)0x0," ");
                      }
                    }
                    else {
                      printf("Unknown command \'%s\'\n",pcVar9);
                    }
                  }
                  goto LAB_001030ee;
                }
                pcVar9 = strtok((char *)0x0," ");
                printf("Loading from \'%s\'\n",pcVar9);
                load = true;
              }
              bVar18 = false;
              transfer_state(load,pcVar9,&local_10b8);
            }
          }
        }
LAB_001030ee:
        command_count = command_count - 1;
        free(*commands);
        memmove(commands,commands + 1,(ulong)command_count << 3);
        commands = (char **)realloc(commands,(ulong)command_count << 3);
        if (bVar18) {
          requested_pause = false;
        }
      } while (!(bool)(bVar18 | command_count == 0));
    }
    if (requested_pause == false) {
      lVar17 = 1;
      do {
        if ((steps != 0xffffffff) && (steps = steps - 1, steps == 0)) {
          requested_pause = true;
        }
        tick(&local_10b8);
        bVar12 = trace;
        bVar14 = local_10b8.mSFR[0x10];
        if ((bVar14 & 1) == 0) {
          if (local_10b8.mPC == 0x23bb) {
            puts("Trying to find ATAPI handler");
          }
          else if (local_10b8.mPC == 0x27e2) {
            uVar16 = (ulong)(local_10b8.mSFR[0x50] & 0x18);
            printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n",
                   (ulong)local_10b8.mLowerData[uVar16 + 7],(ulong)local_10b8.mLowerData[uVar16 + 5]
                   ,(ulong)local_10b8.mLowerData[uVar16 + 3]);
          }
        }
        else {
          bVar12 = trace & local_10b8.mPC - 0x23caU < 0xffffffca;
        }
        if ((bVar12 & 1) != 0) {
          printf("bank %d: 0x%04X",(ulong)(bVar14 & 1),(ulong)(uint)local_10b8.mPC);
          printf(" R6: 0x%02X",
                 (ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 6]);
          printf(" R4R5: 0x%02X%02X",
                 (ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 4],
                 (ulong)local_10b8.mLowerData[(ulong)(local_10b8.mSFR[0x50] & 0x18) + 5]);
          printf(" interrupt-active:%d",(ulong)(uint)local_10b8.mInterruptActive);
          printf(" IE.EA:%d",(ulong)(local_10b8.mSFR[0x28] & 0xffffff80));
          printf(" IE.EX1:%d",(ulong)(local_10b8.mSFR[0x28] & 4));
          printf(" TCON.IE1:%d",(ulong)(local_10b8.mSFR[8] & 8));
          printf(" IP.PX1:%d",(ulong)(local_10b8.mSFR[0x38] & 4));
          printf(" P1.5:%d",(ulong)(local_10b8.mSFR[0x10] >> 5 & 1));
          printf(" P1.6:%d",(ulong)(local_10b8.mSFR[0x10] >> 6 & 1));
          printf(" flash-state:%d/%d",(ulong)flash_state,(ulong)flash_chip_id);
          printf(" SCSI:");
          if (0 < scsi_count) {
            lVar13 = 0;
            do {
              printf("%02X",(ulong)scsi_buffer[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 < scsi_count);
          }
          printf(" %llu",lVar17);
          putchar(10);
        }
        lVar17 = lVar17 + 1;
      } while (requested_pause == false);
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  // Load the firmware
  //FIXME: Turn into a command
  assert(argc > 1);
  FILE* f = fopen(argv[1], "rb");
  size_t ret = fread(flash, 1, sizeof(flash), f);
  assert(ret == sizeof(flash));
  fclose(f);

  // Create the virtual CPU
  struct em8051 _emu;
  memset(&_emu, 0, sizeof(_emu));

  // Set up virtual CPU
  struct em8051* emu = &_emu;
  emu->mCodeMem     = malloc(0x10000);
  emu->mCodeMemSize = 0x10000;
  emu->mExtData     = malloc(0x10000);
  emu->mExtDataSize = 0x10000;
  emu->mLowerData   = malloc(0x100);
  emu->mUpperData   = &emu->mLowerData[0x80];
  emu->mSFR         = malloc(0x80);
  emu->except       = emu_exception;
  emu->sfrread      = emu_sfrread;
  emu->sfrwrite = sfrwrite;
  emu->xread = xread;
  emu->xwrite = xwrite;

  // Reset virtual CPU
  reset(emu, 1);

  // Load bank 0 of firmware to memory
  load_bank(emu);

  // Process commands from command line
  for(int i = 2; i < argc; i++) {
    add_command(argv[i]);
  }

  // Enable pausing of emulator  
  install_pause_handler();


  // Start mainloop
  char* previous_command_line = strdup("");
  while(true) {

    // Check if we have to enter the shell
    if (requested_pause) {

      // Only handle pause if we no longer have anything queued
      if (command_count == 0) {

        printf("> ");
        char command_line[200];
        fgets(command_line, sizeof(command_line), stdin);

        char* newline = strchr(command_line, '\n');
        if (newline == command_line) {
          strcpy(command_line, previous_command_line);
        } else {
          *newline = '\0';

          free(previous_command_line);
          previous_command_line = strdup(command_line);
        }

        //FIXME: Split line by ;
        add_command(command_line);
      }

    }

    // Process all queued commands until we are supposed to run
    while(command_count > 0) {
      char* command_line = commands[0];
      printf("Command '%s'\n", command_line);
      bool run = handle_command(emu, command_line);
      delete_command();
      if (run) {
        requested_pause = false;
        break;
      }
    }

    // Run the CPU
    unsigned long long n = 1;
    while(!requested_pause) {

      // Use step counter
      if (steps != (unsigned int)-1) {
        steps--;
        if (steps == 0) {
          requested_pause = true;
        }
      }

      int ticked = tick(emu);
      unsigned int bank_index = emu->mSFR[REG_P1] & 1;

      bool info = trace;

      if (bank_index == 0) {
        switch(emu->mPC) {
        case 0x27e2:
          printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n", RX(7), RX(5), RX(3));
          //assert(false);
          break;
        case 0x23bb:
          printf("Trying to find ATAPI handler\n");
          break;
        }
      }

      if (bank_index == 1) {
        switch(emu->mPC) {

        case 0x2394 ... 0x23C9:
          // This is a rather tight loop that takes a while
          info = false;
          break;

        }
      }

      if(info) {
        printf("bank %d: 0x%04X", bank_index, emu->mPC);
        printf(" R6: 0x%02X", RX(6));
        printf(" R4R5: 0x%02X%02X", RX(4), RX(5));
        printf(" interrupt-active:%d", emu->mInterruptActive);
        printf(" IE.EA:%d", emu->mSFR[REG_IE] & IEMASK_EA);
        printf(" IE.EX1:%d", emu->mSFR[REG_IE] & IEMASK_EX1);
        printf(" TCON.IE1:%d", emu->mSFR[REG_TCON] & TCONMASK_IE1);
        printf(" IP.PX1:%d", emu->mSFR[REG_IP] & IPMASK_PX1);
        printf(" P1.5:%d", (emu->mSFR[REG_P1] >> 5) & 1);
        printf(" P1.6:%d", (emu->mSFR[REG_P1] >> 6) & 1);
        printf(" flash-state:%d/%d", flash_state, flash_chip_id);
        printf(" SCSI:");
        for(int i = 0; i < scsi_count; i++) {
          printf("%02X", scsi_buffer[i]);
        }
        printf(" %llu", n);
        printf("\n");
      }

      n++;

    }

  }

  return 0;
}